

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmFor(ExpressionContext *ctx,VmModule *module,ExprFor *node)

{
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmBlock *block_02;
  VmValue *pVVar1;
  LoopInfo local_40;
  
  CompileVm(ctx,module,node->initializer);
  block = anon_unknown.dwarf_11cad6::CreateBlock(module,(node->super_ExprBase).source,"for_cond");
  block_00 = anon_unknown.dwarf_11cad6::CreateBlock(module,(node->super_ExprBase).source,"for_body")
  ;
  block_01 = anon_unknown.dwarf_11cad6::CreateBlock(module,(node->super_ExprBase).source,"for_iter")
  ;
  block_02 = anon_unknown.dwarf_11cad6::CreateBlock(module,(node->super_ExprBase).source,"for_exit")
  ;
  local_40.breakBlock = block_02;
  local_40.continueBlock = block_01;
  SmallArray<VmModule::LoopInfo,_32U>::push_back(&module->loopInfo,&local_40);
  anon_unknown.dwarf_11cad6::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  pVVar1 = CompileVm(ctx,module,node->condition);
  anon_unknown.dwarf_11cad6::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block_00->super_VmValue,
             &block_02->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  CompileVm(ctx,module,node->body);
  anon_unknown.dwarf_11cad6::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  CompileVm(ctx,module,node->increment);
  anon_unknown.dwarf_11cad6::CreateJump(module,(node->super_ExprBase).source,&block->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_02);
  module->currentBlock = block_02;
  SmallArray<VmModule::LoopInfo,_32U>::pop_back(&module->loopInfo);
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmFor(ExpressionContext &ctx, VmModule *module, ExprFor *node)
{
	CompileVm(ctx, module, node->initializer);

	VmBlock *conditionBlock = CreateBlock(module, node->source, "for_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "for_body");
	VmBlock *iterationBlock = CreateBlock(module, node->source, "for_iter");
	VmBlock *exitBlock = CreateBlock(module, node->source, "for_exit");

	module->loopInfo.push_back(VmModule::LoopInfo(exitBlock, iterationBlock));

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	VmValue* condition = CompileVm(ctx, module, node->condition);

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	CompileVm(ctx, module, node->body);

	CreateJump(module, node->source, iterationBlock);

	module->currentFunction->AddBlock(iterationBlock);
	module->currentBlock = iterationBlock;

	CompileVm(ctx, module, node->increment);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	module->loopInfo.pop_back();

	return CheckType(ctx, node, CreateVoid(module));
}